

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog.cpp
# Opt level: O3

bool __thiscall ins::Configuration::Configure(Configuration *this,int type,string *val)

{
  bool bVar1;
  int iVar2;
  LLog *this_00;
  
  if (type == 0) {
    iVar2 = std::__cxx11::string::compare((char *)val);
    if (iVar2 == 0) {
      this->log_level_ = VERBOSE;
    }
    iVar2 = std::__cxx11::string::compare((char *)val);
    if (iVar2 == 0) {
      this->log_level_ = INFO;
    }
    iVar2 = std::__cxx11::string::compare((char *)val);
    if (iVar2 == 0) {
      this->log_level_ = WARNING;
    }
    iVar2 = std::__cxx11::string::compare((char *)val);
    bVar1 = true;
    if (iVar2 == 0) {
      this->log_level_ = ERROR;
    }
  }
  else {
    if (type == 1) {
      this_00 = LLog::Instance();
      bVar1 = LLog::DupLogToFile(this_00,val);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Configuration::Configure(int type, const std::string &val) noexcept {
  switch (type) {
    case LOG_FILE:{
      return LLog::Instance().DupLogToFile(val);
    }
    case LOG_LEVEL:{
      if (val == "VERBOSE") log_level_ = VERBOSE;
      if (val == "INFO") log_level_ = INFO;
      if (val == "WARNING") log_level_ = WARNING;
      if (val == "ERROR") log_level_ = ERROR;
      return true;
    }
    default:
      return false;
  }
}